

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_utils.cpp
# Opt level: O3

void HydroUtils::ComputeFluxes
               (Box *bx,Array4<double> *fx,Array4<double> *fy,Array4<double> *fz,
               Array4<const_double> *umac,Array4<const_double> *vmac,Array4<const_double> *wmac,
               Array4<const_double> *xed,Array4<const_double> *yed,Array4<const_double> *zed,
               Geometry *geom,int ncomp,bool fluxes_are_area_weighted)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  double *pdVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  double *pdVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  double *pdVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  bool bVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  int local_cc;
  double *local_c8;
  double *local_b8;
  
  if (fluxes_are_area_weighted) {
    dVar33 = (geom->super_CoordSys).dx[0];
    dVar1 = (geom->super_CoordSys).dx[1];
    dVar34 = (geom->super_CoordSys).dx[2];
    dVar35 = dVar1 * dVar34;
    dVar34 = dVar34 * dVar33;
    dVar33 = dVar33 * dVar1;
  }
  else {
    dVar35 = 1.0;
    dVar34 = 1.0;
    dVar33 = 1.0;
  }
  local_cc = (bx->smallend).vect[2];
  iVar28 = (bx->bigend).vect[2];
  uVar2 = (bx->btype).itype;
  uVar20 = (ulong)(uint)ncomp;
  if (0 < ncomp) {
    lVar11 = fx->jstride;
    lVar12 = fx->kstride;
    lVar13 = fx->nstride;
    iVar3 = (fx->begin).z;
    lVar14 = umac->jstride;
    lVar15 = umac->kstride;
    iVar4 = (umac->begin).z;
    iVar5 = (bx->smallend).vect[1];
    lVar31 = (long)iVar5;
    iVar6 = (bx->smallend).vect[0];
    lVar25 = (long)iVar6;
    iVar7 = (umac->begin).y;
    local_c8 = fx->p + (((lVar31 - (fx->begin).y) * lVar11 + lVar25) - (long)(fx->begin).x);
    iVar8 = (umac->begin).x;
    pdVar16 = umac->p;
    lVar17 = xed->jstride;
    lVar18 = xed->kstride;
    local_b8 = xed->p + (((lVar31 - (xed->begin).y) * lVar17 + lVar25) - (long)(xed->begin).x);
    lVar19 = xed->nstride;
    iVar9 = (xed->begin).z;
    iVar30 = (~uVar2 & 1) + (bx->bigend).vect[0];
    iVar10 = (bx->bigend).vect[1];
    uVar24 = 0;
    do {
      iVar23 = local_cc;
      if (local_cc <= iVar28) {
        do {
          if (iVar5 <= iVar10) {
            lVar21 = (long)iVar23;
            pdVar26 = (double *)((lVar21 - iVar3) * lVar12 * 8 + (long)local_c8);
            lVar29 = (long)pdVar16 +
                     (lVar21 - iVar4) * lVar15 * 8 +
                     lVar25 * 8 + (lVar31 - iVar7) * lVar14 * 8 + (long)iVar8 * -8;
            pdVar22 = (double *)((lVar21 - iVar9) * lVar18 * 8 + (long)local_b8);
            lVar21 = lVar31;
            do {
              if (iVar6 <= iVar30) {
                lVar27 = 0;
                do {
                  pdVar26[lVar27] = pdVar22[lVar27] * *(double *)(lVar29 + lVar27 * 8) * dVar35;
                  lVar27 = lVar27 + 1;
                } while ((iVar30 - iVar6) + 1 != (int)lVar27);
              }
              lVar21 = lVar21 + 1;
              pdVar26 = pdVar26 + lVar11;
              lVar29 = lVar29 + lVar14 * 8;
              pdVar22 = pdVar22 + lVar17;
            } while (iVar10 + 1 != (int)lVar21);
          }
          bVar32 = iVar23 != iVar28;
          iVar23 = iVar23 + 1;
        } while (bVar32);
      }
      uVar24 = uVar24 + 1;
      local_c8 = local_c8 + lVar13;
      local_b8 = local_b8 + lVar19;
    } while (uVar24 != uVar20);
    local_cc = (bx->smallend).vect[2];
    iVar28 = (bx->bigend).vect[2];
  }
  if (0 < ncomp) {
    lVar11 = fy->jstride;
    lVar12 = fy->kstride;
    lVar13 = fy->nstride;
    iVar3 = (fy->begin).z;
    lVar14 = vmac->jstride;
    iVar30 = (bx->bigend).vect[1] + (uint)((uVar2 & 2) == 0);
    iVar4 = (bx->smallend).vect[1];
    lVar31 = (long)iVar4;
    iVar5 = (bx->smallend).vect[0];
    lVar25 = (long)iVar5;
    iVar6 = (vmac->begin).y;
    local_c8 = fy->p + (((lVar31 - (fy->begin).y) * lVar11 + lVar25) - (long)(fy->begin).x);
    iVar7 = (vmac->begin).x;
    lVar15 = yed->jstride;
    pdVar16 = vmac->p;
    lVar17 = vmac->kstride;
    iVar8 = (vmac->begin).z;
    local_b8 = yed->p + (((lVar31 - (yed->begin).y) * lVar15 + lVar25) - (long)(yed->begin).x);
    lVar18 = yed->kstride;
    lVar19 = yed->nstride;
    iVar9 = (yed->begin).z;
    iVar10 = (bx->bigend).vect[0];
    uVar24 = 0;
    do {
      iVar23 = local_cc;
      if (local_cc <= iVar28) {
        do {
          if (iVar4 <= iVar30) {
            lVar21 = (long)iVar23;
            pdVar22 = (double *)((lVar21 - iVar3) * lVar12 * 8 + (long)local_c8);
            lVar29 = (long)pdVar16 +
                     (lVar21 - iVar8) * lVar17 * 8 +
                     lVar25 * 8 + (lVar31 - iVar6) * lVar14 * 8 + (long)iVar7 * -8;
            pdVar26 = (double *)((lVar21 - iVar9) * lVar18 * 8 + (long)local_b8);
            lVar21 = lVar31;
            do {
              if (iVar5 <= iVar10) {
                lVar27 = 0;
                do {
                  pdVar22[lVar27] = pdVar26[lVar27] * *(double *)(lVar29 + lVar27 * 8) * dVar34;
                  lVar27 = lVar27 + 1;
                } while ((iVar10 - iVar5) + 1 != (int)lVar27);
              }
              lVar21 = lVar21 + 1;
              pdVar22 = pdVar22 + lVar11;
              lVar29 = lVar29 + lVar14 * 8;
              pdVar26 = pdVar26 + lVar15;
            } while (iVar30 + 1 != (int)lVar21);
          }
          bVar32 = iVar23 != iVar28;
          iVar23 = iVar23 + 1;
        } while (bVar32);
      }
      uVar24 = uVar24 + 1;
      local_c8 = local_c8 + lVar13;
      local_b8 = local_b8 + lVar19;
    } while (uVar24 != uVar20);
    local_cc = (bx->smallend).vect[2];
    iVar28 = (bx->bigend).vect[2];
  }
  iVar28 = iVar28 + (uint)((uVar2 & 4) == 0);
  if (0 < ncomp) {
    lVar11 = fz->jstride;
    lVar12 = fz->kstride;
    lVar13 = fz->nstride;
    iVar3 = (fz->begin).z;
    lVar14 = wmac->jstride;
    iVar4 = (bx->smallend).vect[1];
    lVar25 = (long)iVar4;
    iVar5 = (bx->smallend).vect[0];
    lVar31 = (long)iVar5;
    iVar6 = (wmac->begin).y;
    local_c8 = fz->p + (((lVar25 - (fz->begin).y) * lVar11 + lVar31) - (long)(fz->begin).x);
    iVar7 = (wmac->begin).x;
    lVar15 = zed->jstride;
    lVar17 = wmac->kstride;
    pdVar16 = wmac->p;
    iVar8 = (wmac->begin).z;
    local_b8 = zed->p + (((lVar25 - (zed->begin).y) * lVar15 + lVar31) - (long)(zed->begin).x);
    lVar18 = zed->kstride;
    lVar19 = zed->nstride;
    iVar9 = (zed->begin).z;
    iVar10 = (bx->bigend).vect[0];
    iVar30 = (bx->bigend).vect[1];
    uVar24 = 0;
    do {
      iVar23 = local_cc;
      if (local_cc <= iVar28) {
        do {
          if (iVar4 <= iVar30) {
            lVar21 = (long)iVar23;
            pdVar22 = (double *)((lVar21 - iVar3) * lVar12 * 8 + (long)local_c8);
            lVar29 = (long)pdVar16 +
                     (lVar21 - iVar8) * lVar17 * 8 +
                     lVar31 * 8 + (lVar25 - iVar6) * lVar14 * 8 + (long)iVar7 * -8;
            pdVar26 = (double *)((lVar21 - iVar9) * lVar18 * 8 + (long)local_b8);
            lVar21 = lVar25;
            do {
              if (iVar5 <= iVar10) {
                lVar27 = 0;
                do {
                  pdVar22[lVar27] = pdVar26[lVar27] * *(double *)(lVar29 + lVar27 * 8) * dVar33;
                  lVar27 = lVar27 + 1;
                } while ((iVar10 - iVar5) + 1 != (int)lVar27);
              }
              lVar21 = lVar21 + 1;
              pdVar22 = pdVar22 + lVar11;
              lVar29 = lVar29 + lVar14 * 8;
              pdVar26 = pdVar26 + lVar15;
            } while (iVar30 + 1 != (int)lVar21);
          }
          bVar32 = iVar23 != iVar28;
          iVar23 = iVar23 + 1;
        } while (bVar32);
      }
      uVar24 = uVar24 + 1;
      local_c8 = local_c8 + lVar13;
      local_b8 = local_b8 + lVar19;
    } while (uVar24 != uVar20);
  }
  return;
}

Assistant:

void
HydroUtils::ComputeFluxes ( Box const& bx,
                            AMREX_D_DECL( Array4<Real> const& fx,
                                          Array4<Real> const& fy,
                                          Array4<Real> const& fz),
                            AMREX_D_DECL( Array4<Real const> const& umac,
                                          Array4<Real const> const& vmac,
                                          Array4<Real const> const& wmac),
                            AMREX_D_DECL( Array4<Real const> const& xed,
                                          Array4<Real const> const& yed,
                                          Array4<Real const> const& zed),
                            Geometry const& geom, const int ncomp,
                            const bool fluxes_are_area_weighted )
{
#if (AMREX_SPACEDIM == 2)
    if (geom.IsRZ()) {
        // Need metrics when using RZ
        Array<FArrayBox,AMREX_SPACEDIM> area;
        Array<Elixir,AMREX_SPACEDIM> area_eli;
        if (fluxes_are_area_weighted) {
            for (int dir = 0; dir < AMREX_SPACEDIM; ++dir)
            {
                const int ngrow_area = 0;
                geom.GetFaceArea(area[dir],BoxArray(bx),0,dir,ngrow_area);
                area_eli[dir] = area[dir].elixir();
            }
        }
        const auto& ax = (fluxes_are_area_weighted) ? area[0].const_array()
                                                    : Array4<const Real>{};
        const auto& ay = (fluxes_are_area_weighted) ? area[1].const_array()
                                                    : Array4<const Real>{};
        //
        //  X flux
        //
        const Box& xbx = amrex::surroundingNodes(bx,0);
        amrex::ParallelFor(xbx, ncomp, [fx, umac, xed, ax, fluxes_are_area_weighted]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (fluxes_are_area_weighted) {
                fx(i,j,k,n) = xed(i,j,k,n) * umac(i,j,k) * ax(i,j,k);
            } else {
                fx(i,j,k,n) = xed(i,j,k,n) * umac(i,j,k);
            }
        });

        //
        //  Y flux
        //
        const Box& ybx = amrex::surroundingNodes(bx,1);
        amrex::ParallelFor(ybx, ncomp, [fy, vmac, yed, ay, fluxes_are_area_weighted]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (fluxes_are_area_weighted) {
                fy(i,j,k,n) = yed(i,j,k,n) * vmac(i,j,k) * ay(i,j,k);
            } else {
                fy(i,j,k,n) = yed(i,j,k,n) * vmac(i,j,k);
            }
        });
    } else
#endif
    {
        const auto dx = geom.CellSizeArray();

        GpuArray<Real,AMREX_SPACEDIM> area;
#if ( AMREX_SPACEDIM == 3 )
        if (fluxes_are_area_weighted) {
            area[0] = dx[1]*dx[2];
            area[1] = dx[0]*dx[2];
            area[2] = dx[0]*dx[1];
        } else {
            area[0] = 1.; area[1] = 1.; area[2] = 1.;
        }
#else
        if (fluxes_are_area_weighted) {
            area[0] = dx[1];
            area[1] = dx[0];
        } else {
            area[0] = 1.; area[1] = 1.;
        }
#endif

        //
        //  X flux
        //
        const Box& xbx = amrex::surroundingNodes(bx,0);
        amrex::ParallelFor(xbx, ncomp, [fx, umac, xed, area]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            fx(i,j,k,n) = xed(i,j,k,n) * umac(i,j,k) * area[0];
        });

        //
        //  Y flux
        //
        const Box& ybx = amrex::surroundingNodes(bx,1);
        amrex::ParallelFor(ybx, ncomp, [fy, vmac, yed, area]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            fy(i,j,k,n) = yed(i,j,k,n) * vmac(i,j,k) * area[1];
        });

#if ( AMREX_SPACEDIM == 3 )
        //
        //  Z flux
        //
        const Box& zbx = amrex::surroundingNodes(bx,2);
        amrex::ParallelFor(zbx, ncomp, [fz, wmac, zed, area]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            fz(i,j,k,n) = zed(i,j,k,n) * wmac(i,j,k) * area[2];
        });
#endif
    }

}